

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_metadata.cpp
# Opt level: O1

ArrowSchemaMetadata *
duckdb::ArrowSchemaMetadata::NonCanonicalType
          (ArrowSchemaMetadata *__return_storage_ptr__,string *type_name,string *vendor_name)

{
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> *this;
  mapped_type *pmVar1;
  pointer pCVar2;
  ComplexJSON *pCVar3;
  type this_00;
  ComplexJSON *complex_json;
  key_type local_80;
  _Head_base<0UL,_duckdb::ComplexJSON_*,_false> local_60;
  _Head_base<0UL,_duckdb::ComplexJSON_*,_false> local_58;
  string local_50;
  
  ArrowSchemaMetadata(__return_storage_ptr__);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"ARROW:extension:name","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"arrow.opaque","");
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)__return_storage_ptr__,&local_80);
  ::std::__cxx11::string::_M_assign((string *)pmVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  this = &__return_storage_ptr__->extension_metadata_map;
  pCVar2 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
           operator->(this);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"vendor_name","");
  pCVar3 = (ComplexJSON *)operator_new(0x60);
  ComplexJSON::ComplexJSON(pCVar3,vendor_name);
  local_58._M_head_impl = pCVar3;
  ComplexJSON::AddObject
            (pCVar2,&local_80,
             (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> *)
             &local_58);
  std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
            ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)&local_58
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  pCVar2 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
           operator->(this);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"type_name","");
  pCVar3 = (ComplexJSON *)operator_new(0x60);
  ComplexJSON::ComplexJSON(pCVar3,type_name);
  local_60._M_head_impl = pCVar3;
  ComplexJSON::AddObject
            (pCVar2,&local_80,
             (unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> *)
             &local_60);
  std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
            ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)&local_60
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"ARROW:extension:metadata","");
  this_00 = unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true>::
            operator*(this);
  StringUtil::ToComplexJSONMap_abi_cxx11_(&local_50,(StringUtil *)this_00,complex_json);
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)__return_storage_ptr__,&local_80);
  ::std::__cxx11::string::_M_assign((string *)pmVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ArrowSchemaMetadata ArrowSchemaMetadata::NonCanonicalType(const string &type_name, const string &vendor_name) {
	ArrowSchemaMetadata metadata;
	metadata.AddOption(ARROW_EXTENSION_NAME, ArrowExtensionMetadata::ARROW_EXTENSION_NON_CANONICAL);
	// We have to set the metadata key with type_name and vendor_name.
	metadata.extension_metadata_map->AddObject("vendor_name", make_uniq<ComplexJSON>(vendor_name));
	metadata.extension_metadata_map->AddObject("type_name", make_uniq<ComplexJSON>(type_name));
	metadata.AddOption(ARROW_METADATA_KEY, StringUtil::ToComplexJSONMap(*metadata.extension_metadata_map));
	return metadata;
}